

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_error.c
# Opt level: O2

void TIFFErrorExtR(TIFF *tif,char *module,char *fmt,...)

{
  char in_AL;
  int iVar1;
  undefined8 in_RCX;
  thandle_t pvVar2;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list ap;
  __va_list_tag local_f8;
  undefined1 local_d8 [24];
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  
  if (in_AL != '\0') {
    local_a8 = in_XMM0_Qa;
    local_98 = in_XMM1_Qa;
    local_88 = in_XMM2_Qa;
    local_78 = in_XMM3_Qa;
    local_68 = in_XMM4_Qa;
    local_58 = in_XMM5_Qa;
    local_48 = in_XMM6_Qa;
    local_38 = in_XMM7_Qa;
  }
  local_c0 = in_RCX;
  local_b8 = in_R8;
  local_b0 = in_R9;
  if ((tif != (TIFF *)0x0) && (tif->tif_errorhandler != (TIFFErrorHandlerExtR)0x0)) {
    local_f8.reg_save_area = local_d8;
    local_f8.overflow_arg_area = &ap[0].overflow_arg_area;
    local_f8.gp_offset = 0x18;
    local_f8.fp_offset = 0x30;
    iVar1 = (*tif->tif_errorhandler)(tif,tif->tif_errorhandler_user_data,module,fmt,&local_f8);
    if (iVar1 != 0) {
      return;
    }
  }
  if (_TIFFerrorHandler != (TIFFErrorHandler)0x0) {
    local_f8.reg_save_area = local_d8;
    local_f8.overflow_arg_area = &ap[0].overflow_arg_area;
    local_f8.gp_offset = 0x18;
    local_f8.fp_offset = 0x30;
    (*_TIFFerrorHandler)(module,fmt,&local_f8);
  }
  if (_TIFFerrorHandlerExt != (TIFFErrorHandlerExt)0x0) {
    local_f8.reg_save_area = local_d8;
    local_f8.overflow_arg_area = &ap[0].overflow_arg_area;
    local_f8.gp_offset = 0x18;
    local_f8.fp_offset = 0x30;
    if (tif == (TIFF *)0x0) {
      pvVar2 = (thandle_t)0x0;
    }
    else {
      pvVar2 = tif->tif_clientdata;
    }
    (*_TIFFerrorHandlerExt)(pvVar2,module,fmt,&local_f8);
  }
  return;
}

Assistant:

void TIFFErrorExtR(TIFF *tif, const char *module, const char *fmt, ...)
{
    va_list ap;
    if (tif && tif->tif_errorhandler)
    {
        va_start(ap, fmt);
        int stop = (*tif->tif_errorhandler)(
            tif, tif->tif_errorhandler_user_data, module, fmt, ap);
        va_end(ap);
        if (stop)
            return;
    }
    if (_TIFFerrorHandler)
    {
        va_start(ap, fmt);
        (*_TIFFerrorHandler)(module, fmt, ap);
        va_end(ap);
    }
    if (_TIFFerrorHandlerExt)
    {
        va_start(ap, fmt);
        (*_TIFFerrorHandlerExt)(tif ? tif->tif_clientdata : NULL, module, fmt,
                                ap);
        va_end(ap);
    }
}